

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  OptionAdder *pOVar1;
  size_t sVar2;
  OptionValue *pOVar3;
  uint *puVar4;
  double *pdVar5;
  uchar *puVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  signals;
  allocator<char> local_8a4;
  allocator<char> local_8a3;
  allocator<char> local_8a2;
  allocator<char> local_8a1;
  allocator<char> local_8a0;
  allocator<char> local_89f;
  allocator<char> local_89e;
  allocator<char> local_89d;
  allocator<char> local_89c;
  allocator<char> local_89b;
  allocator<char> local_89a;
  allocator<char> local_899;
  allocator<char> local_898;
  allocator<char> local_897;
  allocator<char> local_896;
  allocator<char> local_895;
  allocator<char> local_894;
  allocator<char> local_893;
  allocator<char> local_892;
  allocator<char> local_891;
  allocator<char> local_890;
  allocator<char> local_88f;
  allocator<char> local_88e;
  allocator<char> local_88d;
  allocator<char> local_88c;
  allocator<char> local_88b;
  allocator<char> local_88a;
  allocator<char> local_889;
  string local_888;
  int argc_local;
  element_type *local_858;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_850;
  element_type *local_848;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_840;
  shared_ptr<const_cxxopts::Value> local_838;
  element_type *local_828;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_820;
  shared_ptr<const_cxxopts::Value> local_818;
  element_type *local_808;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_800;
  shared_ptr<const_cxxopts::Value> local_7f8;
  element_type *local_7e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_7e0;
  shared_ptr<const_cxxopts::Value> local_7d8;
  element_type *local_7c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_7c0;
  shared_ptr<const_cxxopts::Value> local_7b8;
  element_type *local_7a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_7a0;
  shared_ptr<const_cxxopts::Value> local_798;
  char **argv_local;
  string output_path;
  random_signal_generator rsg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_720;
  shared_ptr<const_cxxopts::Value> local_718;
  element_type *local_708;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_700;
  shared_ptr<const_cxxopts::Value> local_6f8;
  shared_ptr<const_cxxopts::Value> local_6e8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  ParseResult arguments;
  Options options;
  
  argc_local = argc;
  argv_local = argv;
  pcd::random_signal_generator::random_signal_generator(&rsg,100,25.0,10.0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_path,"",(allocator<char> *)&arguments);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"random_signal_generator",(allocator<char> *)&arguments);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"A command line tool for generating random signals.",
             (allocator<char> *)&signals);
  cxxopts::Options::Options(&options,&local_378,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"",&local_889);
  cxxopts::Options::add_options((OptionAdder *)&arguments,&options,&local_3b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&signals,"p,n_points",&local_88a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"The length of the generated signal in data points. DEFAULT: 100",
             &local_88b);
  cxxopts::value<unsigned_int>();
  local_798.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_7a8;
  local_798.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_7a0._M_pi;
  local_7a8 = (element_type *)0x0;
  _Stack_7a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"",&local_88c);
  pOVar1 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&arguments,(string *)&signals,&local_888,&local_798,&local_3d8)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"m,desired_mean",&local_88d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,
             "The desired mean amplitude of the generated signal. DEFAULT: 25.0",&local_88e);
  cxxopts::value<double>();
  local_7b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_7c8;
  local_7b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_7c0._M_pi;
  local_7c8 = (element_type *)0x0;
  _Stack_7c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"",&local_88f);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_3f8,&local_418,&local_7b8,&local_438);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"d,desired_standard_deviation",&local_890);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,
             "The desired standard deviation in the amplitude of the generated signal. DEFAULT: 10.0"
             ,&local_891);
  cxxopts::value<double>();
  local_7d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_7e8;
  local_7d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_7e0._M_pi;
  local_7e8 = (element_type *)0x0;
  _Stack_7e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_498,"",&local_892);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_458,&local_478,&local_7d8,&local_498);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"b,n_bases",&local_893);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,
             "The number of bases to use for generating the signal. DEFAULT: 50",&local_894);
  cxxopts::value<unsigned_char>();
  local_7f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_808;
  local_7f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_800._M_pi;
  local_808 = (element_type *)0x0;
  _Stack_800._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"",&local_895);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_4b8,&local_4d8,&local_7f8,&local_4f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"f,max_frequency",&local_896);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,
             "The maximum frequency of the generated signal over number of points specified. DEFAULT: 10.0"
             ,&local_897);
  cxxopts::value<double>();
  local_818.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_828;
  local_818.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_820._M_pi;
  local_828 = (element_type *)0x0;
  _Stack_820._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"",&local_898);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_518,&local_538,&local_818,&local_558);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"n,noise_percentage",&local_899);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,
             "The amount of Gaussian noise to add as a percentage of the desired standard deviation. DEFAULT: 0.0"
             ,&local_89a);
  cxxopts::value<double>();
  local_838.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_848;
  local_838.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_840._M_pi;
  local_848 = (element_type *)0x0;
  _Stack_840._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,"",&local_89b);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_578,&local_598,&local_838,&local_5b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"o,output_file",&local_89c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,
             "The desired CSV output file to write the signal to. If not specified, outputs to screen."
             ,&local_89d);
  cxxopts::value<std::__cxx11::string>();
  local_6e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_858;
  local_6e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_850._M_pi;
  local_858 = (element_type *)0x0;
  _Stack_850._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"",&local_89e);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_5d8,&local_5f8,&local_6e8,&local_618);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_638,"s,n_signals",&local_89f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"The number of random signals to generate. DEFAULT: 1",&local_8a0)
  ;
  cxxopts::value<unsigned_int>();
  local_6f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_708;
  local_6f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_700._M_pi;
  local_708 = (element_type *)0x0;
  _Stack_700._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"",&local_8a1);
  pOVar1 = cxxopts::OptionAdder::operator()(pOVar1,&local_638,&local_658,&local_6f8,&local_678);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"h,help",&local_8a2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"Display help.",&local_8a3);
  cxxopts::value<bool>();
  local_718.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_720._M_pi;
  _Stack_720._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,"",&local_8a4);
  cxxopts::OptionAdder::operator()(pOVar1,&local_698,&local_6b8,&local_718,&local_6d8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_718.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_720);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_6f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_700);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_618);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_6e8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_850);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_838.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_840);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_558);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_818.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_820);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_7f8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_800);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_498);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_7d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_7e0);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_438);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_7b8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_7c0);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_798.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_7a0);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&signals);
  std::__cxx11::string::~string
            ((string *)
             &arguments.m_options.
              super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_3b8);
  cxxopts::Options::parse(&arguments,&options,&argc_local,&argv_local);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&signals,"p",(allocator<char> *)&local_888);
  sVar2 = cxxopts::ParseResult::count(&arguments,(string *)&signals);
  std::__cxx11::string::~string((string *)&signals);
  if (sVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&signals,"p",(allocator<char> *)&local_888);
    pOVar3 = cxxopts::ParseResult::operator[](&arguments,(string *)&signals);
    puVar4 = cxxopts::OptionValue::as<unsigned_int>(pOVar3);
    rsg.n_points = *puVar4;
    std::__cxx11::string::~string((string *)&signals);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&signals,"m",(allocator<char> *)&local_888);
  sVar2 = cxxopts::ParseResult::count(&arguments,(string *)&signals);
  std::__cxx11::string::~string((string *)&signals);
  if (sVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&signals,"m",(allocator<char> *)&local_888);
    pOVar3 = cxxopts::ParseResult::operator[](&arguments,(string *)&signals);
    pdVar5 = cxxopts::OptionValue::as<double>(pOVar3);
    rsg.desired_mean = *pdVar5;
    std::__cxx11::string::~string((string *)&signals);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&signals,"d",(allocator<char> *)&local_888);
  sVar2 = cxxopts::ParseResult::count(&arguments,(string *)&signals);
  std::__cxx11::string::~string((string *)&signals);
  if (sVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&signals,"d",(allocator<char> *)&local_888);
    pOVar3 = cxxopts::ParseResult::operator[](&arguments,(string *)&signals);
    pdVar5 = cxxopts::OptionValue::as<double>(pOVar3);
    rsg.desired_standard_deviation = *pdVar5;
    std::__cxx11::string::~string((string *)&signals);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&signals,"b",(allocator<char> *)&local_888);
  sVar2 = cxxopts::ParseResult::count(&arguments,(string *)&signals);
  std::__cxx11::string::~string((string *)&signals);
  if (sVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&signals,"b",(allocator<char> *)&local_888);
    pOVar3 = cxxopts::ParseResult::operator[](&arguments,(string *)&signals);
    puVar6 = cxxopts::OptionValue::as<unsigned_char>(pOVar3);
    rsg.n_bases = *puVar6;
    std::__cxx11::string::~string((string *)&signals);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&signals,"f",(allocator<char> *)&local_888);
  sVar2 = cxxopts::ParseResult::count(&arguments,(string *)&signals);
  std::__cxx11::string::~string((string *)&signals);
  if (sVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&signals,"f",(allocator<char> *)&local_888);
    pOVar3 = cxxopts::ParseResult::operator[](&arguments,(string *)&signals);
    pdVar5 = cxxopts::OptionValue::as<double>(pOVar3);
    rsg.max_frequency = *pdVar5;
    std::__cxx11::string::~string((string *)&signals);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&signals,"n",(allocator<char> *)&local_888);
  sVar2 = cxxopts::ParseResult::count(&arguments,(string *)&signals);
  std::__cxx11::string::~string((string *)&signals);
  if (sVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&signals,"n",(allocator<char> *)&local_888);
    pOVar3 = cxxopts::ParseResult::operator[](&arguments,(string *)&signals);
    pdVar5 = cxxopts::OptionValue::as<double>(pOVar3);
    rsg.noise_percentage = *pdVar5;
    std::__cxx11::string::~string((string *)&signals);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&signals,"o",(allocator<char> *)&local_888);
  sVar2 = cxxopts::ParseResult::count(&arguments,(string *)&signals);
  std::__cxx11::string::~string((string *)&signals);
  if (sVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&signals,"o",(allocator<char> *)&local_888);
    pOVar3 = cxxopts::ParseResult::operator[](&arguments,(string *)&signals);
    cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
    std::__cxx11::string::_M_assign((string *)&output_path);
    std::__cxx11::string::~string((string *)&signals);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&signals,"s",(allocator<char> *)&local_888);
  sVar2 = cxxopts::ParseResult::count(&arguments,(string *)&signals);
  std::__cxx11::string::~string((string *)&signals);
  if (sVar2 == 0) {
    uVar8 = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&signals,"s",(allocator<char> *)&local_888);
    pOVar3 = cxxopts::ParseResult::operator[](&arguments,(string *)&signals);
    puVar4 = cxxopts::OptionValue::as<unsigned_int>(pOVar3);
    uVar8 = (ulong)*puVar4;
    std::__cxx11::string::~string((string *)&signals);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&signals,"h",(allocator<char> *)&local_888);
  sVar2 = cxxopts::ParseResult::count(&arguments,(string *)&signals);
  std::__cxx11::string::~string((string *)&signals);
  if (sVar2 == 0) {
    cxxopts::ParseResult::~ParseResult(&arguments);
    signals.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    signals.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    signals.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (lVar9 = 0; uVar8 * 0x18 - lVar9 != 0; lVar9 = lVar9 + 0x18) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Generating signal ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7," of ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::operator<<(poVar7,"...\r");
      std::ostream::flush();
      arguments.m_options.
      super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      arguments.m_options.
      super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      arguments.m_positional.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&signals,(value_type *)&arguments);
      pcd::random_signal_generator::generate
                (&rsg,(vector<double,_std::allocator<double>_> *)
                      ((long)&((signals.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start + lVar9));
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&arguments);
    }
    poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar7 = std::operator<<(poVar7,"Done generating signals.");
    std::endl<char,std::char_traits<char>>(poVar7);
    if (output_path._M_string_length == 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Writing to console...");
      std::endl<char,std::char_traits<char>>(poVar7);
      write_output((ostream *)&std::cout,&signals);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,"Writing to file \"");
      poVar7 = std::operator<<(poVar7,(string *)&output_path);
      poVar7 = std::operator<<(poVar7,"\"...");
      std::endl<char,std::char_traits<char>>(poVar7);
      std::ofstream::ofstream(&arguments);
      std::ofstream::open((string *)&arguments,(_Ios_Openmode)&output_path);
      write_output((ostream *)&arguments,&signals);
      std::ofstream::close();
      std::ofstream::~ofstream(&arguments);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"Done.");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&signals);
  }
  else {
    local_888._M_dataplus._M_p = (pointer)0x0;
    local_888._M_string_length = 0;
    local_888.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              ((string *)&signals,&options,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_888);
    poVar7 = std::operator<<((ostream *)&std::cout,(string *)&signals);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&signals);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_888);
    cxxopts::ParseResult::~ParseResult(&arguments);
  }
  cxxopts::Options::~Options(&options);
  std::__cxx11::string::~string((string *)&output_path);
  pcd::random_signal_generator::~random_signal_generator(&rsg);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    // Set up random_signal_generator with default parameters.
    pcd::random_signal_generator rsg(100, 25.0, 10.0);

    // Set up default output file string.
    std::string output_path = "";

    // Set up default n_signals.
    uint32_t n_signals = 1;

    // Parse user arguments.
    // Set up options.
    cxxopts::Options options("random_signal_generator", "A command line tool for generating random signals.");
    options.add_options()
        ("p,n_points", "The length of the generated signal in data points. DEFAULT: 100", cxxopts::value<uint32_t>())
        ("m,desired_mean", "The desired mean amplitude of the generated signal. DEFAULT: 25.0", cxxopts::value<double>())
        ("d,desired_standard_deviation", "The desired standard deviation in the amplitude of the generated signal. DEFAULT: 10.0", cxxopts::value<double>())
        ("b,n_bases", "The number of bases to use for generating the signal. DEFAULT: 50", cxxopts::value<uint8_t>())
        ("f,max_frequency", "The maximum frequency of the generated signal over number of points specified. DEFAULT: 10.0", cxxopts::value<double>())
        ("n,noise_percentage", "The amount of Gaussian noise to add as a percentage of the desired standard deviation. DEFAULT: 0.0", cxxopts::value<double>())
        ("o,output_file", "The desired CSV output file to write the signal to. If not specified, outputs to screen.", cxxopts::value<std::string>())
        ("s,n_signals", "The number of random signals to generate. DEFAULT: 1", cxxopts::value<uint32_t>())
        ("h,help", "Display help.");
    try
    {
        // Parse options.
        auto arguments = options.parse(argc, argv);
        // Update parameters if provided.
        if(arguments.count("p"))
        {
            rsg.n_points = arguments["p"].as<uint32_t>();
        }
        if(arguments.count("m"))
        {
            rsg.desired_mean = arguments["m"].as<double>();
        }
        if(arguments.count("d"))
        {
            rsg.desired_standard_deviation = arguments["d"].as<double>();
        }
        if(arguments.count("b"))
        {
            rsg.n_bases = arguments["b"].as<uint8_t>();
        }
        if(arguments.count("f"))
        {
            rsg.max_frequency = arguments["f"].as<double>();
        }
        if(arguments.count("n"))
        {
            rsg.noise_percentage = arguments["n"].as<double>();
        }
        if(arguments.count("o"))
        {
            output_path = arguments["o"].as<std::string>();
        }
        if(arguments.count("s"))
        {
            n_signals = arguments["s"].as<uint32_t>();
        }
        if(arguments.count("h"))
        {
            std::cout << options.help() << std::endl;
            return 0;
        }
    }
    catch(const cxxopts::OptionParseException& e)
    {
        std::cerr << e.what() << std::endl;
        return 1;
    }

    // Create vectors for storing signals.
    std::vector<std::vector<double>> signals;

    // Run the generator.
    for(uint32_t i = 0; i < n_signals; i++)
    {
        std::cout << "Generating signal " << i + 1 << " of " << n_signals << "...\r";
        std::cout.flush();

        std::vector<double> signal;
        signals.push_back(signal);
        rsg.generate(signals[i]);
    }
    std::cout << std::endl << "Done generating signals." << std::endl;

    // Write output.
    if(!output_path.empty())
    {
        std::cout << "Writing to file \"" << output_path << "\"..." << std::endl;
        try
        {
            std::ofstream output_file;
            output_file.open(output_path, std::ios::out);
            write_output(output_file, signals);
            output_file.close();
        }
        catch(const std::exception& e)
        {
            std::cerr << e.what() << std::endl;
            return 2;
        }
    }
    else
    {
        std::cout << "Writing to console..." << std::endl;
        write_output(std::cout, signals);
    }

    std::cout << "Done." << std::endl;

    return 0;
}